

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::TextureParamVerifiers::GetTexParameterIVerifier::verifyInteger
          (GetTexParameterIVerifier *this,TestContext *testCtx,GLenum target,GLenum name,
          GLint reference)

{
  ostringstream *this_00;
  bool bVar1;
  StateQueryMemoryWriteGuard<int> state;
  undefined1 local_1b0 [384];
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard(&state);
  glu::CallLogWrapper::glGetTexParameteriv
            (&(this->super_TexParamVerifier).super_CallLogWrapper,target,name,&state.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity(&state,testCtx)
  ;
  if ((bVar1) && (state.m_value != reference)) {
    local_1b0._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"// ERROR: expected ");
    std::ostream::operator<<(this_00,reference);
    std::operator<<((ostream *)this_00,"; got ");
    std::ostream::operator<<(this_00,state.m_value);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid texture param value")
      ;
    }
  }
  return;
}

Assistant:

void GetTexParameterIVerifier::verifyInteger (tcu::TestContext& testCtx, GLenum target, GLenum name, GLint reference)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint> state;
	glGetTexParameteriv(target, name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state != reference)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected " << reference << "; got " << state << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid texture param value");
	}
}